

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall Js::JavascriptArray::JavascriptArray(JavascriptArray *this,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  
  DynamicObject::DynamicObject((DynamicObject *)this,type,false);
  (this->super_ArrayObject).length = 0;
  (this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0150cf40;
  (this->head).ptr = (SparseArraySegmentBase *)0x0;
  uVar3 = (ulong)(type->super_Type).typeId;
  if ((0x21 < uVar3) ||
     (((0x160000000U >> (uVar3 & 0x3f) & 1) == 0 &&
      (((0x210000000U >> (uVar3 & 0x3f) & 1) == 0 ||
       ((DynamicObject *)(type->super_Type).prototype.ptr !=
        (((((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
              javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
          super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).arrayPrototype.
        ptr)))))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x17f,
                                "(type->GetTypeId() == TypeIds_Array || type->GetTypeId() == TypeIds_NativeIntArray || type->GetTypeId() == TypeIds_NativeFloatArray || ((type->GetTypeId() == TypeIds_ES5Array || type->GetTypeId() == TypeIds_Object) && type->GetPrototype() == GetScriptContext()->GetLibrary()->GetArrayPrototype()))"
                                ,
                                "type->GetTypeId() == TypeIds_Array || type->GetTypeId() == TypeIds_NativeIntArray || type->GetTypeId() == TypeIds_NativeFloatArray || ((type->GetTypeId() == TypeIds_ES5Array || type->GetTypeId() == TypeIds_Object) && type->GetPrototype() == GetScriptContext()->GetLibrary()->GetArrayPrototype())"
                               );
    if (!bVar2) goto LAB_00b790d0;
    *puVar4 = 0;
  }
  if (((EmptySegment->length != 0) || (EmptySegment->size != 0)) ||
     ((EmptySegment->next).ptr != (SparseArraySegmentBase *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x180,
                                "(EmptySegment->length == 0 && EmptySegment->size == 0 && EmptySegment->next == __null)"
                                ,
                                "EmptySegment->length == 0 && EmptySegment->size == 0 && EmptySegment->next == NULL"
                               );
    if (!bVar2) {
LAB_00b790d0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  DynamicObject::InitArrayFlags((DynamicObject *)this,InitialArrayValue);
  SetHeadAndLastUsedSegment(this,EmptySegment);
  return;
}

Assistant:

JavascriptArray::JavascriptArray(DynamicType * type)
        : ArrayObject(type, false, 0)
    {
        Assert(type->GetTypeId() == TypeIds_Array || type->GetTypeId() == TypeIds_NativeIntArray || type->GetTypeId() == TypeIds_NativeFloatArray || ((type->GetTypeId() == TypeIds_ES5Array || type->GetTypeId() == TypeIds_Object) && type->GetPrototype() == GetScriptContext()->GetLibrary()->GetArrayPrototype()));
        Assert(EmptySegment->length == 0 && EmptySegment->size == 0 && EmptySegment->next == NULL);
        InitArrayFlags(DynamicObjectFlags::InitialArrayValue);
        SetHeadAndLastUsedSegment(const_cast<SparseArraySegmentBase *>(EmptySegment));

    }